

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int check_not_in_range(unsigned_long value,unsigned_long check_value_data)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  CheckIntegerRange *check_integer_range;
  char *range_min;
  
  range_min = in_RSI;
  _assert_true((unsigned_long)check_integer_range,in_RDI,in_RSI,(int)((ulong)in_RSI >> 0x20));
  iVar1 = integer_not_in_range_display_error
                    ((unsigned_long)in_RDI,(unsigned_long)range_min,(unsigned_long)in_RSI);
  return iVar1;
}

Assistant:

static int check_not_in_range(const LargestIntegralType value,
                              const LargestIntegralType check_value_data) {
    CheckIntegerRange * const check_integer_range =
        cast_largest_integral_type_to_pointer(CheckIntegerRange*,
                                              check_value_data);
    assert_non_null(check_integer_range);
    return integer_not_in_range_display_error(
        value, check_integer_range->minimum, check_integer_range->maximum);
}